

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

void QLibraryStore::releaseLibrary(QLibraryPrivate *lib)

{
  long lVar1;
  bool bVar2;
  QLibraryPrivate *c;
  QLibraryPrivate *in_RDI;
  long in_FS_OFFSET;
  size_type n;
  QLibraryStore *data;
  QMutexLocker<QBasicMutex> locker;
  QBasicMutex *in_stack_ffffffffffffff98;
  QLibraryPrivate *in_stack_ffffffffffffffa0;
  anon_class_8_1_ba1d5de5 p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QBasicMutex>::QMutexLocker
            ((QMutexLocker<QBasicMutex> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  c = (QLibraryPrivate *)instance();
  p.lib = c;
  bVar2 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x8c69ff);
  if (!bVar2) {
    if ((p.lib != (QLibraryPrivate *)0x0) && (bVar2 = QString::isEmpty((QString *)0x8c6a50), !bVar2)
       ) {
      q20::
      erase_if<QString,QLibraryPrivate*,std::less<QString>,QLibraryStore::releaseLibrary(QLibraryPrivate*)::_lambda(auto:1_const&)_1_>
                ((map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
                  *)c,p);
    }
    in_stack_ffffffffffffffa0 = in_RDI;
    if (in_RDI != (QLibraryPrivate *)0x0) {
      QLibraryPrivate::~QLibraryPrivate(in_RDI);
      operator_delete(in_RDI,0xb0);
      in_stack_ffffffffffffffa0 = in_RDI;
    }
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QLibraryStore::releaseLibrary(QLibraryPrivate *lib)
{
    QMutexLocker locker(&qt_library_mutex);
    QLibraryStore *data = instance();

    if (lib->libraryRefCount.deref()) {
        // still in use
        return;
    }

    // no one else is using
    Q_ASSERT(lib->libraryUnloadCount.loadRelaxed() == 0);

    if (Q_LIKELY(data) && !lib->fileName.isEmpty()) {
        using q20::erase_if;
        const auto n = erase_if(data->libraryMap, [lib](const auto &e) {
            return e.second == lib;
        });
        Q_ASSERT_X(n, "~QLibrary", "Did not find this library in the library map");
        Q_UNUSED(n);
    }
    delete lib;
}